

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incgamma.cpp
# Opt level: O1

double numerary::Numerary::incgamma(double *a,double *x,double *eps)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = *a;
  dVar2 = 1.0 / dVar3;
  dVar4 = 0.0;
  if (*eps < dVar2) {
    iVar1 = 1;
    do {
      dVar4 = dVar4 + dVar2;
      dVar2 = dVar2 * (*x / ((double)iVar1 + dVar3));
      iVar1 = iVar1 + 1;
    } while (*eps < dVar2);
  }
  dVar3 = pow(*x,dVar3);
  dVar2 = exp(-*x);
  return dVar2 * dVar3 * dVar4;
}

Assistant:

double Numerary::incgamma(const double& a, const double& x, const double& eps)
    {
        double term=1.0/a, sum = 0;
        int n=1;
        while (term > eps) {
            sum = sum + term;
            term = term*(x/(a+n));
            n++;
        }

        return pow(x,a)*exp(-1*x)*sum;
    }